

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<SynBinaryOpElement,_32U>::grow(SmallArray<SynBinaryOpElement,_32U> *this,uint newSize)

{
  undefined4 uVar1;
  SynBinaryOpElement *pSVar2;
  SynBinaryOpElement *pSVar3;
  uint local_24;
  SynBinaryOpElement *pSStack_20;
  uint i;
  SynBinaryOpElement *newData;
  uint newSize_local;
  SmallArray<SynBinaryOpElement,_32U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    pSStack_20 = NULLC::construct<SynBinaryOpElement>(newData._4_4_);
  }
  else {
    pSStack_20 = Allocator::construct<SynBinaryOpElement>(this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    pSVar3 = this->data + local_24;
    pSVar2 = pSStack_20 + local_24;
    pSVar2->begin = pSVar3->begin;
    pSVar2->end = pSVar3->end;
    uVar1 = *(undefined4 *)&pSVar3->field_0x14;
    pSVar2->type = pSVar3->type;
    *(undefined4 *)&pSVar2->field_0x14 = uVar1;
    pSVar2->value = pSVar3->value;
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<SynBinaryOpElement>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<SynBinaryOpElement>(this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = pSStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}